

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

wtree_object wtree_init(wave_object wave,int siglength,int J)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  wtree_object pwVar6;
  int iVar7;
  int iVar8;
  
  if (J < 0x65) {
    iVar4 = wave->filtlength;
    uVar2 = wmaxiter(siglength);
    if (J <= (int)uVar2) {
      if (J < 1) {
        iVar8 = 0;
        iVar7 = 0;
      }
      else {
        iVar5 = 1;
        iVar7 = 0;
        iVar8 = 0;
        iVar3 = J;
        do {
          iVar7 = iVar7 + iVar5 * 2;
          iVar1 = iVar5 * 2;
          iVar5 = iVar5 * 2;
          iVar8 = iVar8 + (iVar1 + -1) * (iVar4 + -2);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      iVar4 = (J + 1) * siglength;
      iVar5 = iVar4 + iVar8;
      iVar3 = iVar5 + iVar7 + J;
      pwVar6 = (wtree_object)malloc((long)iVar3 * 8 + 0x208);
      pwVar6->outlength = iVar5;
      builtin_strncpy(pwVar6->ext,"sym",4);
      pwVar6->wave = wave;
      pwVar6->siglength = siglength;
      pwVar6->J = J;
      pwVar6->MaxIter = uVar2;
      builtin_strncpy(pwVar6->method,"dwt",4);
      pwVar6->even = ~siglength & 1;
      pwVar6->cobj = (conv_object)0x0;
      pwVar6->nodes = iVar7;
      pwVar6->cfftset = 0;
      pwVar6->lenlength = J + 2;
      pwVar6->output = (double *)(pwVar6 + 1);
      pwVar6->nodelength = (int *)(pwVar6[1].method + (long)iVar5 * 8 + -0x10);
      pwVar6->coeflength = (int *)(pwVar6[1].method + (long)(iVar5 + iVar7) * 8 + -0x10);
      if (-1 < iVar3) {
        memset(pwVar6 + 1,0,(ulong)(iVar4 + iVar8 + iVar7 + J + 1) << 3);
      }
      return pwVar6;
    }
    printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n",
           (ulong)uVar2);
  }
  else {
    puts("\n The Decomposition Iterations Cannot Exceed 100. Exiting ");
  }
  exit(-1);
}

Assistant:

wtree_object wtree_init(wave_object wave, int siglength,int J) {
    int size,i,MaxIter,temp,temp2,elength,nodes;
	wtree_object obj = NULL;

	size = wave->filtlength;

	if (J > 100) {
		printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
		exit(-1);
	}


	MaxIter = wmaxiter(siglength);
	if (J > MaxIter) {
		printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n", MaxIter);
		exit(-1);
	}
	temp = 1;
	elength = 0;
	nodes = 0;
	for(i = 0; i < J;++i) {
	  temp *= 2;
	  nodes += temp;
	  temp2 = (size - 2) * (temp - 1);
	  elength += temp2;
	}

	obj = (wtree_object)malloc(sizeof(struct wtree_set) + sizeof(double)* (siglength * (J + 1) + elength + nodes + J + 1));
	obj->outlength = siglength * (J + 1) + elength;
	strcpy(obj->ext, "sym");

	obj->wave = wave;
	obj->siglength = siglength;
	obj->J = J;
	obj->MaxIter = MaxIter;
	strcpy(obj->method, "dwt");

	if (siglength % 2 == 0) {
		obj->even = 1;
	}
	else {
		obj->even = 0;
	}

	obj->cobj = NULL;
	obj->nodes = nodes;

	obj->cfftset = 0;
	obj->lenlength = J + 2;
	obj->output = &obj->params[0];
	obj->nodelength = (int*) &obj->params[siglength * (J + 1) + elength];
	obj->coeflength = (int*)&obj->params[siglength * (J + 1) + elength + nodes];

	for (i = 0; i < siglength * (J + 1) + elength + nodes + J + 1; ++i) {
	       obj->params[i] = 0.0;
	}

	//wave_summary(obj->wave);

	return obj;
}